

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O2

void __thiscall
xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::AddEdge
          (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *this,SquareCell sstate,
          SquareCell dstate,double trans)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_28;
  double local_20;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_18;
  
  local_20 = trans;
  local_28._M_cur = (__node_type *)ObtainVertexFromVertexMap(this,sstate);
  plVar1 = (long *)(*(long *)((long)local_28._M_cur + 0x10) + 0x28);
  plVar3 = plVar1;
  do {
    plVar3 = (long *)*plVar3;
    if (plVar3 == plVar1) {
      local_18._M_cur = (__node_type *)ObtainVertexFromVertexMap(this,dstate);
      std::__cxx11::
      list<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
      ::push_back((list<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
                   *)(*(long *)((long)local_18._M_cur + 0x10) + 0x40),(value_type *)&local_28);
      std::__cxx11::
      list<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Edge,std::allocator<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Edge>>
      ::
      emplace_back<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::vertex_iterator&,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::vertex_iterator&,double&>
                ((list<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Edge,std::allocator<xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Edge>>
                  *)(*(long *)((long)&((local_28._M_cur)->
                                      super__Hash_node_value<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>
                                      ._M_storage._M_storage + 8) + 0x28),
                 (vertex_iterator *)&local_28,(vertex_iterator *)&local_18,&local_20);
      return;
    }
  } while (*(long *)(*(long *)(plVar3[3] + 0x10) + 0x10) != dstate.id);
  plVar3[4] = (long)trans;
  std::operator<<((ostream *)&std::cout,"updated cost: ");
  poVar2 = std::ostream::_M_insert<double>(trans);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::AddEdge(State sstate, State dstate,
                                                     Transition trans) {
  auto src_vertex = ObtainVertexFromVertexMap(sstate);

  // update transition if edge already exists
  auto it = src_vertex->FindEdge(dstate);
  if (it != src_vertex->edge_end()) {
    it->cost = trans;
    std::cout << "updated cost: " << trans << std::endl;
    return;
  }

  // otherwise add new edge
  auto dst_vertex = ObtainVertexFromVertexMap(dstate);
  dst_vertex->vertices_from.push_back(src_vertex);
  src_vertex->edges_to.emplace_back(src_vertex, dst_vertex, trans);
}